

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar_p.h
# Opt level: O1

void __thiscall QTabBarPrivate::Tab::~Tab(Tab *this)

{
  TabBarAnimation *pTVar1;
  Data *pDVar2;
  
  pTVar1 = (this->animation)._M_t.
           super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
           ._M_t.
           super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
           .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl;
  if (pTVar1 != (TabBarAnimation *)0x0) {
    (**(code **)(*(long *)pTVar1 + 0x20))();
  }
  (this->animation)._M_t.
  super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
  ._M_t.
  super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
  .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl =
       (TabBarAnimation *)0x0;
  ::QVariant::~QVariant(&this->data);
  QIcon::~QIcon(&this->icon);
  pDVar2 = (this->accessibleName).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->accessibleName).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->whatsThis).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->whatsThis).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->toolTip).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->toolTip).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->text).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((this->text).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

inline Tab(const QIcon &ico, const QString &txt)
        : text(txt), icon(ico), enabled(true), visible(true), measuringMinimum(false)
        {
        }